

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall ON_PANOSE1::Dump(ON_PANOSE1 *this,ON_TextLog *text_log)

{
  ulong uVar1;
  bool bVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  ON__UINT8 *p;
  ON_wString family;
  ON_wString local_30;
  
  if (this->m_family_kind == Any) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 9) break;
      uVar1 = uVar4 + 1;
    } while ((&this->m_prop1)[uVar4] == '\0');
    if (8 < uVar4) {
      ON_TextLog::Print(text_log,L"PANOSE1::Zero\n");
      return;
    }
  }
  if ((ulong)this->m_family_kind < 6) {
    pwVar3 = (wchar_t *)(&PTR_anon_var_dwarf_25bf7f_0081e820)[this->m_family_kind];
  }
  else {
    pwVar3 = L"";
  }
  ON_wString::ON_wString(&family,pwVar3);
  bVar2 = ON_wString::IsEmpty(&family);
  if (bVar2) {
    ON_wString::FormatToString((wchar_t *)&local_30,L"%u",(ulong)this->m_family_kind);
    ON_wString::operator=(&family,&local_30);
    ON_wString::~ON_wString(&local_30);
  }
  pwVar3 = ON_wString::operator_cast_to_wchar_t_(&family);
  ON_TextLog::Print(text_log,L"PANOSE1: %ls (%u, %u, %u, %u, %u, %u, %u, %u, %u)\n",pwVar3,
                    (ulong)this->m_prop1,(ulong)this->m_prop2,(ulong)this->m_prop3,
                    (ulong)this->m_prop4,(ulong)this->m_prop5,(ulong)this->m_prop6,
                    (ulong)this->m_prop7,(ulong)this->m_prop8,(ulong)this->m_prop9);
  ON_wString::~ON_wString(&family);
  return;
}

Assistant:

void ON_PANOSE1::Dump(
  class ON_TextLog& text_log
) const
{
  if (IsZero())
  {
    text_log.Print(L"PANOSE1::Zero\n");
  }
  else
  {
    ON_wString family = FamilyKindToWideString(m_family_kind);
    if (family.IsEmpty())
      family = ON_wString::FormatToString(L"%u", (unsigned int)m_family_kind);
    text_log.Print(L"PANOSE1: %ls (%u, %u, %u, %u, %u, %u, %u, %u, %u)\n",
      static_cast<const wchar_t*>(family),
      (unsigned int)m_prop1,
      (unsigned int)m_prop2,
      (unsigned int)m_prop3,
      (unsigned int)m_prop4,
      (unsigned int)m_prop5,
      (unsigned int)m_prop6,
      (unsigned int)m_prop7,
      (unsigned int)m_prop8,
      (unsigned int)m_prop9
    );
  }
}